

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void __thiscall pixels::fillDead(pixels *this)

{
  size_type __n;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  int c;
  anon_union_4_2_f9ecb1fe tmp;
  size_t idx;
  int x;
  int y;
  int local_20;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI[1]; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
      __n = (size_type)(local_c * in_RDI[2] + local_10);
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),__n);
      *pvVar1 = 0xdeadbeef;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 10),__n);
      *pvVar2 = -6.2598534e+18;
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x10)
                          ,__n);
      *pvVar3 = 0xdead;
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + (long)local_20 * 6 + 0x16),__n);
        *pvVar3 = 0xdead;
      }
    }
  }
  return;
}

Assistant:

void fillDead ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = 0xDEADBEEF;
                union
                {
                    uint32_t iv;
                    float    fv;
                } tmp;
                tmp.iv = 0xDEADBEEF;
                f[idx] = tmp.fv;
                h[idx] = 0xDEAD;
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] = 0xDEAD;
            }
        }
    }